

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O1

void __thiscall
Imf_3_2::SampleCountChannel::set(SampleCountChannel *this,int x,int y,uint newNumSamples)

{
  uint *oldNumSamples;
  uint *puVar1;
  DeepImageLevel *this_00;
  size_t *psVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  uint *newNumSamples_00;
  size_t *newSampleListPositions;
  uint uVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  size_t i;
  long lVar11;
  long lVar12;
  
  lVar12 = (long)(this->super_ImageChannel)._pixelsPerRow;
  oldNumSamples = this->_numSamples;
  uVar8 = this->_base[y * lVar12 + (long)x];
  lVar11 = (long)(this->_base + y * lVar12 + (long)x) - (long)oldNumSamples;
  if (uVar8 < newNumSamples) {
    i = lVar11 >> 2;
    puVar1 = this->_sampleListSizes;
    if (*(uint *)((long)puVar1 + lVar11) < newNumSamples) {
      uVar5 = 1;
      do {
        uVar6 = uVar5;
        uVar5 = uVar6 * 2;
      } while (uVar6 < newNumSamples);
      if (this->_sampleBufferSize < this->_totalSamplesOccupied + (long)(int)uVar6) {
        this->_totalNumSamples = this->_totalNumSamples + (ulong)(newNumSamples - uVar8);
        uVar9 = (this->super_ImageChannel)._numPixels;
        newNumSamples_00 = (uint *)operator_new__(-(ulong)(uVar9 >> 0x3e != 0) | uVar9 * 4);
        this->_numSamples = newNumSamples_00;
        this_00 = (DeepImageLevel *)(this->super_ImageChannel)._level;
        psVar2 = this->_sampleListPositions;
        this->_base = newNumSamples_00 +
                      (-((this_00->super_ImageLevel)._dataWindow.min.y * lVar12) -
                      (long)(this_00->super_ImageLevel)._dataWindow.min.x);
        newSampleListPositions = (size_t *)operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar9 << 3)
        ;
        this->_sampleListPositions = newSampleListPositions;
        this->_totalSamplesOccupied = 0;
        sVar3 = (this->super_ImageChannel)._numPixels;
        if (sVar3 != 0) {
          sVar7 = 0;
          sVar10 = 0;
          do {
            uVar8 = newNumSamples;
            if (sVar7 != i) {
              uVar8 = oldNumSamples[sVar7];
            }
            newNumSamples_00[sVar7] = uVar8;
            newSampleListPositions[sVar7] = sVar10;
            if (uVar8 == 0) {
              uVar9 = 0;
            }
            else {
              uVar4 = 1;
              do {
                uVar9 = uVar4;
                uVar4 = (ulong)((uint)uVar9 * 2);
              } while ((uint)uVar9 < uVar8);
            }
            puVar1[sVar7] = (uint)uVar9;
            sVar10 = sVar10 + uVar9;
            sVar7 = sVar7 + 1;
          } while (sVar7 != sVar3);
          this->_totalSamplesOccupied = sVar10;
        }
        this->_sampleBufferSize = (this->_totalSamplesOccupied >> 1) + this->_totalSamplesOccupied;
        DeepImageLevel::moveSamplesToNewBuffer
                  (this_00,oldNumSamples,newNumSamples_00,newSampleListPositions);
        if (oldNumSamples != (uint *)0x0) {
          operator_delete__(oldNumSamples);
        }
        if (psVar2 == (size_t *)0x0) {
          return;
        }
        operator_delete__(psVar2);
        return;
      }
      DeepImageLevel::moveSampleList
                ((DeepImageLevel *)(this->super_ImageChannel)._level,i,uVar8,newNumSamples,
                 this->_totalSamplesOccupied);
      this->_sampleListPositions[i] = this->_totalSamplesOccupied;
      this->_totalSamplesOccupied = this->_totalSamplesOccupied + (long)(int)uVar6;
    }
    else {
      DeepImageLevel::setSamplesToZero
                ((DeepImageLevel *)(this->super_ImageChannel)._level,i,uVar8,newNumSamples);
    }
    this->_totalNumSamples =
         this->_totalNumSamples +
         (ulong)(newNumSamples - *(int *)((long)this->_numSamples + lVar11));
    *(uint *)((long)this->_numSamples + lVar11) = newNumSamples;
  }
  else {
    this->_totalNumSamples = this->_totalNumSamples - (ulong)(uVar8 - newNumSamples);
    *(uint *)((long)oldNumSamples + lVar11) = newNumSamples;
  }
  return;
}

Assistant:

void
SampleCountChannel::set (int x, int y, unsigned int newNumSamples)
{
    //
    // Set the number of samples for pixel (x,y) to newNumSamples.
    // Compute the position of the pixel in the the various
    // arrays that describe it.
    //

    size_t i = (_base + y * pixelsPerRow () + x) - _numSamples;

    if (newNumSamples <= _numSamples[i])
    {
        //
        // The number of samples for the pixel becomes smaller.
        // Save the new number of samples.
        //

        _totalNumSamples -= _numSamples[i] - newNumSamples;
        _numSamples[i] = newNumSamples;
        return;
    }

    if (newNumSamples <= _sampleListSizes[i])
    {
        //
        // The number of samples for the pixel becomes larger, but the new
        // number of samples still fits into the space that has been allocated
        // for the sample list.  Set the new samples at the end of the list to
        // zero.
        //

        deepLevel ().setSamplesToZero (i, _numSamples[i], newNumSamples);

        _totalNumSamples += newNumSamples - _numSamples[i];
        _numSamples[i] = newNumSamples;
        return;
    }

    int newSampleListSize = roundListSizeUp (newNumSamples);

    if (_totalSamplesOccupied + newSampleListSize <= _sampleBufferSize)
    {
        //
        // The number of samples in the pixel no longer fits into the
        // space that has been allocated for the sample list, but there
        // is space available at the end of the sample buffer.  Allocate
        // space for a new list at the end of the sample buffer, and move
        // the sample list from its old location to its new, larger place.
        //

        deepLevel ().moveSampleList (
            i, _numSamples[i], newNumSamples, _totalSamplesOccupied);

        _sampleListPositions[i] = _totalSamplesOccupied;
        _totalSamplesOccupied += newSampleListSize;
        _totalNumSamples += newNumSamples - _numSamples[i];
        _numSamples[i] = newNumSamples;
        return;
    }

    //
    // The new number of samples no longer fits into the space that has
    // been allocated for the sample list, and there is not enough room
    // at the end of the sample buffer for a new, larger sample list.
    // Allocate an entirely new sample buffer, and move all existing
    // sample lists into it.
    //

    unsigned int* oldNumSamples          = 0;
    size_t*       oldSampleListPositions = 0;

    try
    {
        _totalNumSamples += newNumSamples - _numSamples[i];

        oldNumSamples = _numSamples;
        _numSamples   = new unsigned int[numPixels ()];

        resetBasePointer ();

        oldSampleListPositions = _sampleListPositions;
        _sampleListPositions   = new size_t[numPixels ()];

        _totalSamplesOccupied = 0;

        for (size_t j = 0; j < numPixels (); ++j)
        {
            if (j == i)
                _numSamples[j] = newNumSamples;
            else
                _numSamples[j] = oldNumSamples[j];

            _sampleListPositions[j] = _totalSamplesOccupied;
            _sampleListSizes[j]     = roundListSizeUp (_numSamples[j]);
            _totalSamplesOccupied += _sampleListSizes[j];
        }

        _sampleBufferSize = roundBufferSizeUp (_totalSamplesOccupied);

        deepLevel ().moveSamplesToNewBuffer (
            oldNumSamples, _numSamples, _sampleListPositions);

        delete[] oldNumSamples;
        delete[] oldSampleListPositions;
    }
    catch (...)
    {
        delete[] oldNumSamples;
        delete[] oldSampleListPositions;

        level ().image ().resize (Box2i (V2i (0, 0), V2i (-1, -1)));
        throw;
    }
}